

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<false,true,true>(DFA *this,SearchParams *params)

{
  byte bVar1;
  const_pointer pcVar2;
  size_type sVar3;
  Prog *pPVar4;
  bool bVar5;
  uint uVar6;
  State *pSVar7;
  State *pSVar8;
  byte *pbVar9;
  const_pointer pcVar10;
  const_pointer pcVar11;
  ulong uVar12;
  const_pointer pcVar13;
  uint c;
  ulong uVar14;
  const_pointer pcVar15;
  StateSaver save_start;
  StateSaver save_s;
  State *local_220;
  StateSaver local_200;
  StateSaver local_1d8;
  undefined1 local_1b0;
  ostringstream local_1a8 [376];
  
  local_220 = params->start;
  pcVar2 = (params->text).data_;
  if ((local_220->flag_ & 0x100) == 0) {
    sVar3 = (params->text).size_;
    pcVar10 = pcVar2 + sVar3;
    pPVar4 = this->prog_;
    pcVar11 = pcVar2 + 1;
    uVar14 = 0;
    pcVar15 = (const_pointer)0x0;
    pcVar13 = pcVar11;
    pSVar8 = local_220;
    do {
      if (-sVar3 == uVar14) {
        pbVar9 = (byte *)((params->text).data_ + (params->text).size_);
        if (pbVar9 == (byte *)((params->context).data_ + (params->context).size_)) {
          uVar6 = this->prog_->bytemap_range_;
          c = 0x100;
        }
        else {
          bVar1 = *pbVar9;
          c = (uint)bVar1;
          uVar6 = (uint)this->prog_->bytemap_[bVar1];
        }
        pSVar7 = pSVar8->next_[(int)uVar6]._M_b._M_p;
        if ((pSVar7 != (State *)0x0) ||
           (pSVar7 = RunStateOnByteUnlocked(this,pSVar8,c), pSVar7 != (State *)0x0))
        goto LAB_00412bbf;
        StateSaver::StateSaver(&local_200,this,pSVar8);
        ResetCache(this,params->cache_lock);
        pSVar8 = StateSaver::Restore(&local_200);
        if (pSVar8 == (State *)0x0) {
LAB_00412b9f:
          params->failed = true;
          bVar5 = false;
          pSVar7 = (State *)0x0;
        }
        else {
          pSVar7 = RunStateOnByteUnlocked(this,pSVar8,c);
          if (pSVar7 == (State *)0x0) {
            local_1b0 = 0;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::operator<<((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset");
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            goto LAB_00412b9f;
          }
          bVar5 = true;
        }
        StateSaver::~StateSaver(&local_200);
        if (!bVar5) {
          return false;
        }
LAB_00412bbf:
        if ((State *)0x2 < pSVar7) {
          uVar6 = pSVar7->flag_ & 0x100;
          if (uVar6 == 0) {
            pcVar10 = (const_pointer)0x0;
          }
          else if ((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) {
            for (uVar14 = (ulong)(uint)pSVar7->ninst_;
                (0 < (int)uVar14 && (pSVar7->inst_[uVar14 - 1] != -2)); uVar14 = uVar14 - 1) {
              SparseSetT<void>::insert(params->matches,pSVar7->inst_[uVar14 - 1]);
            }
          }
          params->ep = pcVar10;
          return SUB41(uVar6 >> 8,0);
        }
        if (pSVar7 != (State *)0x1) {
          params->ep = pcVar10;
          return true;
        }
        params->ep = (char *)0x0;
        return false;
      }
      bVar1 = pcVar13[-1];
      pSVar7 = pSVar8->next_[pPVar4->bytemap_[bVar1]]._M_b._M_p;
      if (pSVar7 == (State *)0x0) {
        pSVar7 = RunStateOnByteUnlocked(this,pSVar8,(uint)bVar1);
        if (pSVar7 == (State *)0x0) {
          if ((((dfa_should_bail_when_slow == '\x01') && (pcVar15 != (const_pointer)0x0)) &&
              ((ulong)((long)pcVar11 - (long)pcVar15) <
               (this->state_cache_)._M_h._M_element_count * 10)) && (this->kind_ != kManyMatch)) {
            params->failed = true;
            return false;
          }
          StateSaver::StateSaver(&local_200,this,local_220);
          StateSaver::StateSaver(&local_1d8,this,pSVar8);
          ResetCache(this,params->cache_lock);
          local_220 = StateSaver::Restore(&local_200);
          if ((local_220 == (State *)0x0) ||
             (pSVar8 = StateSaver::Restore(&local_1d8), pSVar8 == (State *)0x0)) {
LAB_004129a1:
            params->failed = true;
            bVar5 = false;
            pSVar7 = (State *)0x0;
          }
          else {
            pSVar7 = RunStateOnByteUnlocked(this,pSVar8,(uint)bVar1);
            if (pSVar7 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::operator<<((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache")
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              goto LAB_004129a1;
            }
            bVar5 = true;
          }
          StateSaver::~StateSaver(&local_1d8);
          StateSaver::~StateSaver(&local_200);
          pcVar15 = pcVar13;
          if (!bVar5) {
            return false;
          }
        }
      }
      if (pSVar7 < (State *)0x3) {
        if (pSVar7 != (State *)0x1) {
          params->ep = pcVar10;
          return true;
        }
        params->ep = (char *)0x0;
        return false;
      }
      uVar14 = uVar14 - 1;
      pcVar13 = pcVar13 + 1;
      pcVar11 = pcVar11 + 1;
      pSVar8 = pSVar7;
    } while ((pSVar7->flag_ & 0x100) == 0);
    if ((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) {
      for (uVar12 = (ulong)(uint)pSVar7->ninst_;
          (0 < (int)uVar12 && (pSVar7->inst_[uVar12 - 1] != -2)); uVar12 = uVar12 - 1) {
        SparseSetT<void>::insert(params->matches,pSVar7->inst_[uVar12 - 1]);
      }
    }
    params->ep = pcVar2 + ~uVar14;
  }
  else {
    if ((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) {
      for (uVar14 = (ulong)(uint)local_220->ninst_;
          (0 < (int)uVar14 && (local_220->inst_[uVar14 - 1] != -2)); uVar14 = uVar14 - 1) {
        SparseSetT<void>::insert(params->matches,local_220->inst_[uVar14 - 1]);
      }
    }
    params->ep = pcVar2;
  }
  return true;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}